

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGV.cpp
# Opt level: O0

void __thiscall CGV::CGV(CGV *this,ASTNode *root,SymbolTable *_symbolTable)

{
  CodeWriter *this_00;
  ASTNode *pAVar1;
  SymbolTable *_symbolTable_local;
  ASTNode *root_local;
  CGV *this_local;
  
  Visitor::Visitor(&this->super_Visitor);
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR_visit_001a3c28;
  std::__cxx11::string::string((string *)&this->output);
  std::__cxx11::string::string((string *)&this->currentNamespace);
  std::__cxx11::string::string((string *)&this->currentFuncName);
  this->symbolTable = _symbolTable;
  this_00 = (CodeWriter *)operator_new(0x178);
  memset(this_00,0,0x178);
  CodeWriter::CodeWriter(this_00);
  this->writer = this_00;
  pAVar1 = AST::ASTNode::getChild(root,0);
  (**pAVar1->_vptr_ASTNode)(pAVar1,this);
  return;
}

Assistant:

CGV::CGV(AST::ASTNode *root, Semantic::SymbolTable *_symbolTable) {
    this->symbolTable = _symbolTable;
    this->writer = new CodeWriter();
    root->getChild(0)->accept(*this);
}